

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int uint64_log2(uint64_t x)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (x != 0) {
    uVar1 = (uint)(x >> 0x20 != 0) << 5;
    uVar3 = x >> (sbyte)uVar1;
    uVar2 = (uint)(0xffff < uVar3) << 4;
    uVar3 = uVar3 >> (sbyte)uVar2;
    uVar4 = uVar3 >> (0xff < uVar3) * '\b';
    uVar5 = uVar4 >> (0xf < uVar4) * '\x04';
    return (1 < uVar5 >> (3 < uVar5) * '\x02' | uVar1 | uVar2) + (uint)(0xff < uVar3) * 8 +
           (uint)(0xf < uVar4) * 4 + (uint)(3 < uVar5) * 2;
  }
  return -0x80000000;
}

Assistant:

int uint64_log2( uint64_t x )
{
    int a0, a1, a2, a3, a4, a5;
    if (x == 0) return INT_MIN;
    a5 = (x > 0xffffffff)?32:0;
    x >>= a5;
    a4 = (x > 0xffff)?16:0;
    x >>= a4;
    a3 = (x > 0xff)?8:0;
    x >>= a3;
    a2 = (x > 0xf)?4:0;
    x >>= a2;
    a1 = (x > 0x3)?2:0;
    x >>= a1;
    a0 = (x > 0x1)?1:0;
    return a0 + a1 + a2 + a3 + a4 + a5;
}